

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall
Catch::TestGroupStats::TestGroupStats
          (TestGroupStats *this,GroupInfo *_groupInfo,Totals *_totals,bool _aborting)

{
  pointer pcVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  undefined4 uVar7;
  
  this->_vptr_TestGroupStats = (_func_int **)&PTR__TestGroupStats_0019b010;
  (this->groupInfo).name._M_dataplus._M_p = (pointer)&(this->groupInfo).name.field_2;
  pcVar1 = (_groupInfo->name)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->groupInfo,pcVar1,pcVar1 + (_groupInfo->name)._M_string_length);
  sVar2 = _groupInfo->groupsCounts;
  (this->groupInfo).groupIndex = _groupInfo->groupIndex;
  (this->groupInfo).groupsCounts = sVar2;
  uVar7 = *(undefined4 *)&_totals->field_0x4;
  sVar2 = (_totals->assertions).passed;
  sVar3 = (_totals->assertions).failed;
  sVar4 = (_totals->assertions).failedButOk;
  sVar5 = (_totals->testCases).passed;
  sVar6 = (_totals->testCases).failed;
  (this->totals).error = _totals->error;
  *(undefined4 *)&(this->totals).field_0x4 = uVar7;
  (this->totals).assertions.passed = sVar2;
  (this->totals).assertions.failed = sVar3;
  (this->totals).assertions.failedButOk = sVar4;
  (this->totals).testCases.passed = sVar5;
  (this->totals).testCases.failed = sVar6;
  (this->totals).testCases.failedButOk = (_totals->testCases).failedButOk;
  this->aborting = _aborting;
  return;
}

Assistant:

TestGroupStats::TestGroupStats( GroupInfo const& _groupInfo,
                                    Totals const& _totals,
                                    bool _aborting )
    :   groupInfo( _groupInfo ),
        totals( _totals ),
        aborting( _aborting )
    {}